

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O3

string * __thiscall
flatbuffers::BaseGenerator::FullNamespace_abi_cxx11_
          (string *__return_storage_ptr__,BaseGenerator *this,char *separator,Namespace *ns)

{
  ulong *puVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(ulong **)separator;
  if (puVar1 != *(ulong **)(separator + 8)) {
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar1);
      puVar1 = puVar1 + 4;
    } while (puVar1 != *(ulong **)(separator + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::FullNamespace(const char *separator,
                                         const Namespace &ns) {
  std::string namespace_name;
  auto &namespaces = ns.components;
  for (auto it = namespaces.begin(); it != namespaces.end(); ++it) {
    if (namespace_name.length()) namespace_name += separator;
    namespace_name += *it;
  }
  return namespace_name;
}